

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePickerPrivate::updateDaysIfNeeded(DateTimePickerPrivate *this)

{
  int iVar1;
  reference pSVar2;
  qsizetype qVar3;
  int local_3c;
  int month;
  int local_30;
  int year;
  undefined8 local_20;
  QDate date;
  QDateTime dummy;
  DateTimePickerPrivate *this_local;
  
  if ((this->movableSection != -1) &&
     (((this->movableSection == this->monthSection || (this->movableSection == this->yearSection))
      && (this->daysSection != -1)))) {
    QDateTime::QDateTime((QDateTime *)&date,&this->value);
    local_20 = QDateTime::date();
    QDateTime::date();
    local_30 = QDate::year();
    QDateTime::date();
    local_3c = QDate::month();
    if (this->monthSection != -1) {
      pSVar2 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->monthSection);
      local_3c = pSVar2->currentIndex + 1;
    }
    if (this->yearSection != -1) {
      QDateTime::date();
      local_30 = QDate::year();
      pSVar2 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->yearSection);
      local_30 = local_30 + pSVar2->currentIndex;
    }
    QDate::setDate((int)&local_20,local_30,local_3c);
    QDateTime::setDate((QDate *)&date);
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)this->daysSection);
    Section::fillValues(pSVar2,(QDateTime *)&date,&this->minimum,&this->maximum,false);
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)this->daysSection);
    iVar1 = pSVar2->currentIndex;
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)this->daysSection);
    qVar3 = QList<QString>::size(&pSVar2->values);
    if (qVar3 + -1 < (long)iVar1) {
      pSVar2 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->daysSection);
      qVar3 = QList<QString>::size(&pSVar2->values);
      pSVar2 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)this->daysSection);
      pSVar2->currentIndex = (int)qVar3 + -1;
    }
    QDateTime::~QDateTime((QDateTime *)&date);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::updateDaysIfNeeded()
{
	if( movableSection != -1 &&
		( movableSection == monthSection || movableSection == yearSection ) )
	{
		if( daysSection != -1 )
		{
			QDateTime dummy = value;
			QDate date = dummy.date();

			int year = dummy.date().year();
			int month = dummy.date().month();

			if( monthSection != -1 )
				month = sections[ monthSection ].currentIndex + 1;

			if( yearSection != -1 )
				year = minimum.date().year() + sections[ yearSection ].currentIndex;

			date.setDate( year, month, 28 );
			dummy.setDate( date );

			sections[ daysSection ].fillValues( dummy, minimum, maximum,
				false );

			if( sections[ daysSection ].currentIndex >
				sections[ daysSection ].values.size() - 1 )
			{
				sections[ daysSection ].currentIndex =
					sections[ daysSection ].values.size() - 1;
			}
		}
	}
}